

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
::unchecked_insert<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>const&>
          (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
           *this,pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *x)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong hash;
  locator res;
  locator lStack_28;
  
  sVar2 = std::type_info::hash_code((x->first)._M_target);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  hash = SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),0);
  nosize_unchecked_emplace_at<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>const&>
            (&lStack_28,this,(arrays_type *)this,hash >> ((byte)*this & 0x3f),hash,x);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  return;
}

Assistant:

void unchecked_insert(Value&& x) {
        auto hash = hash_for(key_from(x));
        unchecked_emplace_at(position_for(hash), hash, std::forward<Value>(x));
    }